

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

node_t assignment_expression(void)

{
  int iVar1;
  node_t pvVar2;
  char *pcVar3;
  int op;
  node_t right;
  node_t n;
  undefined4 in_stack_ffffffffffffffe0;
  int id;
  
  backtrace_prepare();
  pvVar2 = unary_expression();
  if (pvVar2 == (node_t)0x0) {
    backtrace();
  }
  else {
    iVar1 = assignment_operator();
    id = (int)((ulong)pvVar2 >> 0x20);
    if (iVar1 != 0) {
      iVar1 = t->id;
      next();
      pvVar2 = assignment_expression();
      if (pvVar2 != (node_t)0x0) {
        pvVar2 = binop(id,pvVar2,(node_t)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
        return pvVar2;
      }
      pcVar3 = token_name(iVar1);
      err(E,"expected expression after %s",pcVar3);
      sync();
      return (node_t)0x0;
    }
    backtrace();
  }
  pvVar2 = conditional_expression();
  return pvVar2;
}

Assistant:

node_t assignment_expression()
{
    node_t n = NULL;
    backtrace_prepare();
    
    if ((n = unary_expression()))
    {
        if (assignment_operator())
        {
            node_t right = NULL;
            int op = t->id;
            next();
            if ((right = assignment_expression()))
            {
                n = binop(op, n, right);
                return n;
            }
            err(E, "expected expression after %s", token_name(op));
            sync(";");
            return NULL;
        }
        backtrace();
    }
    else
        backtrace();
    
    return conditional_expression();
}